

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  int iVar1;
  ImGuiTable *pIVar2;
  ImGuiTable *table;
  int i;
  ImGuiContext *g;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *ctx_local;
  
  table._4_4_ = 0;
  while( true ) {
    iVar1 = ImPool<ImGuiTable>::GetMapSize(&ctx->Tables);
    if (table._4_4_ == iVar1) break;
    pIVar2 = ImPool<ImGuiTable>::TryGetMapData(&ctx->Tables,table._4_4_);
    if (pIVar2 != (ImGuiTable *)0x0) {
      pIVar2->SettingsOffset = -1;
    }
    table._4_4_ = table._4_4_ + 1;
  }
  ImChunkStream<ImGuiTableSettings>::clear(&ctx->SettingsTables);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}